

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

string * __thiscall
punky::lex::Lexer::tokenize_identifier_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  
  pcVar1 = (this->m_curr_it)._M_current;
  while( true ) {
    bVar3 = utils::is_letter(this->m_curr_char);
    if (!bVar3) break;
    consume(this);
  }
  pcVar2 = (this->m_curr_it)._M_current;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,pcVar1,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::tokenize_identifier()
{
    const auto ident_begin = m_curr_it;
    while (utils::is_letter(m_curr_char))
        consume();
    return std::string{ident_begin, m_curr_it};
}